

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

CollSeq * sqlite3GetCollSeq(Parse *pParse,u8 enc,CollSeq *pColl,char *zName)

{
  sqlite3 *db;
  _func_int_void_ptr_int_void_ptr_int_void_ptr *p_Var1;
  u8 uVar2;
  undefined7 uVar3;
  char *pcVar4;
  sqlite3_value *v;
  void *pvVar5;
  CollSeq *pCVar6;
  CollSeq *pCVar7;
  long lVar8;
  _func_void_void_ptr *in_R8;
  
  db = pParse->db;
  if (((pColl != (CollSeq *)0x0) ||
      (pColl = sqlite3FindCollSeq(db,enc,zName,0), pColl != (CollSeq *)0x0)) &&
     (pColl->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)) {
    return pColl;
  }
  if (db->xCollNeeded != (_func_void_void_ptr_sqlite3_ptr_int_char_ptr *)0x0) {
    pcVar4 = sqlite3DbStrDup(db,zName);
    if (pcVar4 == (char *)0x0) goto LAB_001542b7;
    (*db->xCollNeeded)(db->pCollNeededArg,db,(uint)enc,pcVar4);
    sqlite3DbFreeNN(db,pcVar4);
  }
  if (db->xCollNeeded16 != (_func_void_void_ptr_sqlite3_ptr_int_void_ptr *)0x0) {
    v = sqlite3ValueNew(db);
    sqlite3ValueSetStr(v,(int)zName,(void *)0x1,'\0',in_R8);
    pvVar5 = sqlite3ValueText(v,'\x02');
    if (pvVar5 != (void *)0x0) {
      (*db->xCollNeeded16)(db->pCollNeededArg,db,(uint)db->enc,pvVar5);
    }
    sqlite3ValueFree(v);
  }
LAB_001542b7:
  pCVar6 = sqlite3FindCollSeq(db,enc,zName,0);
  if (pCVar6 == (CollSeq *)0x0) {
LAB_0015431f:
    pCVar6 = (CollSeq *)0x0;
    sqlite3ErrorMsg(pParse,"no such collation sequence: %s",zName);
  }
  else if (pCVar6->xCmp == (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0) {
    pcVar4 = pCVar6->zName;
    lVar8 = 0;
    do {
      if (lVar8 == 3) goto LAB_0015431f;
      pCVar7 = sqlite3FindCollSeq(db,(&synthCollSeq_aEnc)[lVar8],pcVar4,0);
      lVar8 = lVar8 + 1;
    } while (pCVar7->xCmp == (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0);
    pcVar4 = pCVar7->zName;
    uVar2 = pCVar7->enc;
    uVar3 = *(undefined7 *)&pCVar7->field_0x9;
    p_Var1 = pCVar7->xCmp;
    pCVar6->pUser = pCVar7->pUser;
    pCVar6->xCmp = p_Var1;
    pCVar6->zName = pcVar4;
    pCVar6->enc = uVar2;
    *(undefined7 *)&pCVar6->field_0x9 = uVar3;
    pCVar6->xDel = (_func_void_void_ptr *)0x0;
  }
  return pCVar6;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3GetCollSeq(
  Parse *pParse,        /* Parsing context */
  u8 enc,               /* The desired encoding for the collating sequence */
  CollSeq *pColl,       /* Collating sequence with native encoding, or NULL */
  const char *zName     /* Collating sequence name */
){
  CollSeq *p;
  sqlite3 *db = pParse->db;

  p = pColl;
  if( !p ){
    p = sqlite3FindCollSeq(db, enc, zName, 0);
  }
  if( !p || !p->xCmp ){
    /* No collation sequence of this type for this encoding is registered.
    ** Call the collation factory to see if it can supply us with one.
    */
    callCollNeeded(db, enc, zName);
    p = sqlite3FindCollSeq(db, enc, zName, 0);
  }
  if( p && !p->xCmp && synthCollSeq(db, p) ){
    p = 0;
  }
  assert( !p || p->xCmp );
  if( p==0 ){
    sqlite3ErrorMsg(pParse, "no such collation sequence: %s", zName);
  }
  return p;
}